

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MORE_GTEST_MACROS.hh
# Opt level: O1

AssertionResult
FUNCTION_COMPARE_VEC_EQ<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
          (string *ref_name,vector<double,_std::allocator<double>_> *ref,string *test_name,
          vector<double,_std::allocator<double>_> *test)

{
  double *pdVar1;
  ostream *poVar2;
  AssertionResult *pAVar3;
  pointer pcVar4;
  long lVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *in_R8;
  bool bVar9;
  AssertionResult AVar10;
  stringstream msg;
  AssertionResult local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar9 = test_name->_M_string_length - (long)(test_name->_M_dataplus)._M_p == in_R8[1] - *in_R8;
  if (!bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vector sizes not equal:\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," reference vector, ",0x13);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,
                        (char *)(ref->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start,
                        (long)(ref->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size()=",8);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," test vector, ",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)(test->super__Vector_base<double,_std::allocator<double>_>).
                                       _M_impl.super__Vector_impl_data._M_start,
                        (long)(test->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size()=",8);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  pcVar4 = (test_name->_M_dataplus)._M_p;
  uVar6 = (long)(test_name->_M_string_length - (long)pcVar4) >> 3;
  lVar5 = *in_R8;
  uVar8 = in_R8[1] - lVar5 >> 3;
  if (uVar6 <= uVar8) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar8 = 0;
    do {
      pdVar1 = (double *)(lVar5 + uVar8 * 8);
      if ((*(double *)(pcVar4 + uVar8 * 8) != *pdVar1) ||
         (NAN(*(double *)(pcVar4 + uVar8 * 8)) || NAN(*pdVar1))) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vector element ",0xf);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," not equal:\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," reference, ",0xc);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)(ref->super__Vector_base<double,_std::allocator<double>_>
                                           )._M_impl.super__Vector_impl_data._M_start,
                            (long)(ref->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                  .super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]=",2);
        poVar2 = std::ostream::_M_insert<double>
                           (*(double *)((test_name->_M_dataplus)._M_p + uVar8 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," test, ",7);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)(test->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start,
                            (long)(test->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]=",2);
        poVar2 = std::ostream::_M_insert<double>(*(double *)(*in_R8 + uVar8 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        bVar9 = false;
      }
      uVar8 = uVar8 + 1;
      pcVar4 = (test_name->_M_dataplus)._M_p;
      uVar7 = (long)(test_name->_M_string_length - (long)pcVar4) >> 3;
      lVar5 = *in_R8;
      uVar6 = in_R8[1] - lVar5 >> 3;
      if (uVar7 <= uVar6) {
        uVar6 = uVar7;
      }
    } while (uVar8 < uVar6);
  }
  if (bVar9) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar3 = testing::AssertionResult::operator<<(&local_1e8,(char (*) [2])0x143db5);
    std::__cxx11::stringbuf::str();
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_1d8);
    testing::AssertionResult::AssertionResult((AssertionResult *)ref_name,pAVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1e8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  AVar10.message_.ptr_ = extraout_RDX.ptr_;
  AVar10._0_8_ = ref_name;
  return AVar10;
}

Assistant:

inline
::testing::AssertionResult FUNCTION_COMPARE_VEC_EQ(const std::string& ref_name, const T1& ref, const std::string& test_name, const T2& test) {
    std::stringstream msg;
    bool pass = true;

    //test sizes first
    if( ref.size() != test.size() )
    {
        pass=false;
        msg << "vector sizes not equal:\n"<<
               " reference vector, "<<ref_name<<".size()="<<ref.size()<<"\n"<<
               " test vector, "<<test_name<<".size()="<<test.size()<<"\n";
    }

    //test any elements we can
    for( size_t i=0; i<MIN_SIZE_INTEGER(ref.size(),test.size()); ++i)
    {
        //use equality operator == instead of != to catch more custom comparison
        //operators that may not have != implemented
        if( !( ref[i] == test[i] ) )
        {
            pass=false;
            msg<<"vector element "<<i<<" not equal:\n"<<
               " reference, "<<ref_name<<"["<<i<<"]="<<ref[i]<<"\n"<<
               " test, "<<test_name<<"["<<i<<"]="<<test[i]<<"\n";
        }
    }

    if( pass )return ::testing::AssertionSuccess();

    return ::testing::AssertionFailure() << "\n"<<msg.str();
}